

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_metric(REF_NODE ref_node,char *filename)

{
  REF_MPI pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  FILE *pFVar9;
  FILE *__s;
  REF_DBL RVar10;
  int *piVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  REF_DBL *pRVar17;
  double dVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  REF_INT version;
  REF_INT ldim;
  REF_INT dim;
  REF_INT type;
  REF_INT dim_1;
  REF_INT ntype;
  REF_BOOL csv_format;
  REF_BOOL solb_format;
  REF_INT type_1;
  REF_INT ntype_1;
  REF_INT nnode;
  REF_INT local;
  char line [1024];
  uint local_61c;
  FILE *local_618;
  FILE *local_610;
  int local_604;
  double local_600;
  int local_5f4;
  undefined8 local_5f0;
  uint local_5e4;
  undefined8 local_5e0;
  REF_BOOL local_5d8;
  REF_BOOL local_5d4;
  REF_DBL *local_5d0;
  ulong local_5c8;
  ulong local_5c0;
  ulong local_5b8;
  uint local_5b0;
  int local_5ac;
  REF_DBL *local_5a8;
  REF_DBL local_5a0;
  REF_DBL local_598;
  REF_DBL local_590;
  REF_DBL local_588;
  REF_DBL local_580;
  double local_578 [4];
  REF_DBL local_558;
  double local_550;
  double local_548;
  double local_540;
  REF_DBL local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  short local_510;
  undefined4 uStack_50e;
  
  local_5d4 = 0;
  local_5d8 = 0;
  local_5f4 = -1;
  pRVar1 = ref_node->ref_mpi;
  if (pRVar1->id == 0) {
    sVar7 = strlen(filename);
    iVar2 = strcmp(filename + (sVar7 - 5),".solb");
    if (iVar2 == 0) {
      local_5d4 = 1;
    }
  }
  uVar3 = ref_mpi_all_or(pRVar1,&local_5d4);
  uVar20 = (ulong)uVar3;
  if (uVar3 != 0) {
    pcVar16 = "bcast";
    uVar13 = 0x82b;
    goto LAB_001904da;
  }
  pRVar1 = ref_node->ref_mpi;
  if (local_5d4 != 0) {
    local_578[0] = -NAN;
    if (pRVar1->id != 0) {
      local_618 = (FILE *)0x0;
      goto LAB_00190527;
    }
    uVar3 = ref_import_meshb_header(filename,(REF_INT *)&local_61c,&local_518);
    uVar20 = (ulong)uVar3;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x722,
             "ref_part_metric_solb",uVar20,"header");
      goto LAB_00190e23;
    }
    if (2 < local_61c - 2) {
      pcVar16 = "unsupported version";
      uVar13 = 0x723;
      goto LAB_00190d15;
    }
    pFVar9 = fopen(filename,"r");
    if (pFVar9 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x726,
             "ref_part_metric_solb","unable to open file");
      uVar20 = 2;
    }
    else {
      uVar3 = ref_import_meshb_jump
                        ((FILE *)pFVar9,local_61c,&local_518,3,(REF_BOOL *)&local_5f0,
                         (REF_FILEPOS *)local_578);
      if (uVar3 == 0) {
        if ((uint)local_5f0 == 0) {
          pcVar16 = "solb missing dimension";
          uVar13 = 0x72a;
LAB_00190d15:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar13,"ref_part_metric_solb",pcVar16);
LAB_00190d1c:
          uVar20 = 1;
        }
        else {
          local_618 = pFVar9;
          sVar7 = fread(&local_5e4,4,1,pFVar9);
          pFVar9 = local_618;
          if (sVar7 == 1) {
            if ((local_5e4 & 0xfffffffe) != 2) {
              pcVar16 = "unsupported dimension";
              uVar13 = 0x72c;
              goto LAB_00190d15;
            }
            uVar3 = ref_import_meshb_jump
                              ((FILE *)local_618,local_61c,&local_518,0x3e,(REF_BOOL *)&local_5f0,
                               (REF_FILEPOS *)local_578);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x72f,"ref_part_metric_solb",(ulong)uVar3,"jump");
              uVar20 = (ulong)uVar3;
              goto LAB_00190e23;
            }
            if ((uint)local_5f0 == 0) {
              pcVar16 = "SolAtVertices missing";
              uVar13 = 0x730;
              goto LAB_00190d15;
            }
            RVar5 = ref_part_meshb_long((FILE *)pFVar9,local_61c,(REF_LONG *)&local_5a8);
            if (RVar5 == 0) {
              sVar7 = fread(&local_5ac,4,1,pFVar9);
              if (sVar7 == 1) {
                local_604 = 0;
                iVar2 = local_5ac;
                if (0 < local_5ac) {
                  do {
                    sVar7 = fread(&local_5b0,4,1,local_618);
                    if (sVar7 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x735,"ref_part_metric_solb","type",1,sVar7);
                      uVar20 = 1;
                      goto LAB_00190e23;
                    }
                    if (2 < local_5b0 - 1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x738,"ref_part_metric_solb",
                             "only types 1 (scalar) or 3 (tensor)) supported");
                      printf(" %d type\n",(ulong)local_5b0);
                      goto LAB_00190d1c;
                    }
                    if (local_5b0 == 3) {
                      if (local_5e4 == 2) {
                        local_604 = local_604 + 3;
                      }
                      else {
                        local_604 = local_604 + 6;
                      }
                    }
                    else if (local_5b0 == 1) {
                      local_604 = local_604 + 1;
                    }
                    iVar2 = iVar2 + -1;
                  } while (iVar2 != 0);
                }
                if (local_5e4 == 2) {
                  if (local_604 == 3) {
LAB_00190527:
                    uVar3 = ref_mpi_bcast(ref_node->ref_mpi,&local_61c,1,1);
                    if (uVar3 == 0) {
                      uVar3 = ref_mpi_bcast(ref_node->ref_mpi,&local_5e4,1,1);
                      if (uVar3 == 0) {
                        uVar3 = ref_mpi_bcast(ref_node->ref_mpi,&local_5a8,1,2);
                        if (uVar3 == 0) {
                          uVar3 = ref_mpi_bcast(ref_node->ref_mpi,&local_604,1,2);
                          if (uVar3 == 0) {
                            pRVar17 = (REF_DBL *)ref_node->old_n_global;
                            if ((local_5a8 != pRVar17) &&
                               ((REF_DBL *)((long)local_5a8 / 2) != pRVar17)) {
                              if (pRVar1->id == 0) {
                                printf("file %ld ref_node %ld %s\n",local_5a8,pRVar17,filename);
                              }
                              pcVar16 = "global count mismatch";
                              uVar13 = 0x756;
                              goto LAB_00190d15;
                            }
                            lVar8 = (long)local_5a8 / (long)ref_node->ref_mpi->n;
                            pRVar17 = (REF_DBL *)(long)(int)lVar8;
                            if (lVar8 < 100000) {
                              pRVar17 = (REF_DBL *)0x186a0;
                            }
                            if ((long)local_5a8 <= (long)pRVar17) {
                              pRVar17 = local_5a8;
                            }
                            iVar2 = (int)pRVar17;
                            uVar3 = iVar2 * 6;
                            uVar14 = (ulong)uVar3;
                            if (iVar2 < 0) {
                              uVar20 = 1;
                              pcVar16 = "malloc metric of REF_DBL negative";
LAB_00191be0:
                              bVar22 = false;
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x75d,"ref_part_metric_solb",pcVar16);
                              pFVar9 = (FILE *)0x0;
                            }
                            else {
                              pFVar9 = (FILE *)malloc(uVar14 << 3);
                              if (pFVar9 == (FILE *)0x0) {
                                uVar20 = 2;
                                pcVar16 = "malloc metric of REF_DBL NULL";
                                goto LAB_00191be0;
                              }
                              bVar22 = true;
                              if (iVar2 != 0) {
                                uVar15 = 1;
                                if (1 < (int)uVar3) {
                                  uVar15 = (ulong)uVar3;
                                }
                                uVar12 = 0;
                                do {
                                  *(REF_DBL *)((long)pFVar9 + uVar12 * 8) = -1.0;
                                  uVar12 = uVar12 + 1;
                                } while (uVar15 != uVar12);
                              }
                            }
                            if (bVar22) {
                              if (0 < (long)local_5a8) {
                                dVar18 = 0.0;
                                local_5c0 = CONCAT44(local_5c0._4_4_,uVar3);
                                local_610 = pFVar9;
                                local_5d0 = pRVar17;
                                do {
                                  uVar3 = (int)local_5a8 - SUB84(dVar18,0);
                                  local_5c8 = (ulong)uVar3;
                                  if ((int)local_5d0 < (int)uVar3) {
                                    local_5c8 = (ulong)local_5d0 & 0xffffffff;
                                  }
                                  local_600 = dVar18;
                                  if (ref_node->ref_mpi->id == 0) {
                                    if (0 < (int)local_5c8) {
                                      lVar8 = local_5c8 * 0x30;
                                      lVar19 = 0;
                                      do {
                                        if (local_604 == 3) {
                                          sVar7 = fread((void *)((long)local_610 + lVar19),8,1,
                                                        local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x774,"ref_part_metric_solb","m11",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 8),8,1,
                                                        local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x776,"ref_part_metric_solb","m12",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 0x18),8,
                                                        1,local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x778,"ref_part_metric_solb","m22",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          *(undefined8 *)((long)local_610 + lVar19 + 0x10) = 0;
                                          *(undefined8 *)((long)local_610 + lVar19 + 0x20) = 0;
                                          *(undefined8 *)((long)local_610 + lVar19 + 0x28) =
                                               0x3ff0000000000000;
                                        }
                                        else {
                                          if (local_604 != 6) {
                                            pcVar16 = "not a 2D or 3D ldim";
                                            uVar13 = 0x77d;
                                            goto LAB_00190d15;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19),8,1,
                                                        local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x766,"ref_part_metric_solb","m11",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 8),8,1,
                                                        local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x768,"ref_part_metric_solb","m12",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 0x18),8,
                                                        1,local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x76b,"ref_part_metric_solb","m22",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 0x10),8,
                                                        1,local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x76d,"ref_part_metric_solb","m31",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 0x20),8,
                                                        1,local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x76f,"ref_part_metric_solb","m32",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                          sVar7 = fread((void *)((long)local_610 + lVar19 + 0x28),8,
                                                        1,local_618);
                                          if (sVar7 != 1) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x771,"ref_part_metric_solb","m33",1,sVar7);
                                            uVar20 = 1;
                                            goto LAB_00190e23;
                                          }
                                        }
                                        lVar19 = lVar19 + 0x30;
                                      } while (lVar8 != lVar19);
                                    }
                                    uVar3 = ref_mpi_bcast(ref_node->ref_mpi,local_610,
                                                          (REF_INT)local_5c0,3);
                                    if (uVar3 != 0) {
                                      uVar13 = 0x782;
                                      goto LAB_001920d4;
                                    }
                                  }
                                  else {
                                    uVar3 = ref_mpi_bcast(ref_node->ref_mpi,local_610,
                                                          (REF_INT)uVar14,3);
                                    if (uVar3 != 0) {
                                      uVar13 = 0x786;
LAB_001920d4:
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,uVar13,"ref_part_metric_solb",(ulong)uVar3,"bcast");
                                      uVar20 = (ulong)uVar3;
                                    }
                                  }
                                  if (uVar3 != 0) goto LAB_00190e23;
                                  if (0 < (int)local_5c8) {
                                    local_5b8 = local_5c8 & 0xffffffff;
                                    dVar18 = local_600;
                                    pFVar9 = local_610;
                                    do {
                                      uVar3 = ref_node_local(ref_node,(REF_GLOB)dVar18,
                                                             (REF_INT *)&local_5e0);
                                      if ((uVar3 != 0) && (uVar3 != 5)) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x78a,"ref_part_metric_solb",(ulong)uVar3,"local");
                                        uVar20 = (ulong)uVar3;
                                      }
                                      if ((uVar3 != 5) && (uVar3 != 0)) goto LAB_00190e23;
                                      if (((int)local_5e0 != -1) &&
                                         (uVar3 = ref_node_metric_set(ref_node,(int)local_5e0,
                                                                      (REF_DBL *)pFVar9), uVar3 != 0
                                         )) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x78d,"ref_part_metric_solb",(ulong)uVar3,
                                               "set local node met");
                                        uVar20 = (ulong)uVar3;
                                        goto LAB_00190e23;
                                      }
                                      if (local_5e4 == 2) {
                                        uVar3 = ref_node_local(ref_node,(long)local_5a8 +
                                                                        (long)dVar18,
                                                               (REF_INT *)&local_5e0);
                                        if ((uVar3 != 0) && (uVar3 != 5)) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x791,"ref_part_metric_solb",(ulong)uVar3,"local")
                                          ;
                                          uVar20 = (ulong)uVar3;
                                        }
                                        if ((uVar3 != 5) && (uVar3 != 0)) goto LAB_00190e23;
                                        if (((int)local_5e0 != -1) &&
                                           (uVar3 = ref_node_metric_set(ref_node,(int)local_5e0,
                                                                        (REF_DBL *)pFVar9),
                                           uVar3 != 0)) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x794,"ref_part_metric_solb",(ulong)uVar3,
                                                 "set local node met");
                                          uVar20 = (ulong)uVar3;
                                          goto LAB_00190e23;
                                        }
                                      }
                                      pFVar9 = (FILE *)((long)pFVar9 + 0x30);
                                      dVar18 = (double)((long)dVar18 + 1);
                                      local_5b8 = local_5b8 - 1;
                                    } while (local_5b8 != 0);
                                  }
                                  dVar18 = (double)((long)local_600 + (long)(int)local_5c8);
                                  uVar14 = local_5c0 & 0xffffffff;
                                  pFVar9 = local_610;
                                } while ((long)dVar18 < (long)local_5a8);
                              }
                              if (pFVar9 != (FILE *)0x0) {
                                free(pFVar9);
                              }
                              dVar18 = local_578[0];
                              if (pRVar1->id == 0) {
                                RVar10 = (REF_DBL)ftello(local_618);
                                if (dVar18 == RVar10) {
                                  iVar2 = fclose(local_618);
                                  if (iVar2 == 0) goto LAB_00192303;
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x79e,"ref_part_metric_solb","close file",0,(long)iVar2);
                                  uVar20 = 1;
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x79d,"ref_part_metric_solb","end location",dVar18,RVar10)
                                  ;
                                  uVar20 = 1;
                                }
                              }
                              else {
LAB_00192303:
                                uVar20 = 0;
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x74f,"ref_part_metric_solb",(ulong)uVar3,"bcast ldim");
                            uVar20 = (ulong)uVar3;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x74d,"ref_part_metric_solb",(ulong)uVar3,"bcast nnode");
                          uVar20 = (ulong)uVar3;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x74b,"ref_part_metric_solb",(ulong)uVar3,"bcast dim");
                        uVar20 = (ulong)uVar3;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x749,"ref_part_metric_solb",(ulong)uVar3,"bcast version");
                      uVar20 = (ulong)uVar3;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x743,"ref_part_metric_solb","2D expects 3 terms of 2x2 metric",3,
                           (long)local_604);
                    uVar20 = 1;
                  }
                }
                else {
                  if (local_604 == 6) goto LAB_00190527;
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x745,"ref_part_metric_solb","3D expects 6 terms of 3x3 metric",6,
                         (long)local_604);
                  uVar20 = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x732,"ref_part_metric_solb","ntype",1,sVar7);
                uVar20 = 1;
              }
            }
            else {
              uVar20 = 1;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x731,"ref_part_metric_solb",1,"nnode");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x72b,"ref_part_metric_solb","dim",1,sVar7);
            uVar20 = 1;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x729,"ref_part_metric_solb",(ulong)uVar3,"jump");
        uVar20 = (ulong)uVar3;
      }
    }
LAB_00190e23:
    if ((int)uVar20 == 0) {
      return 0;
    }
    pcVar16 = "part metric .solb";
    uVar13 = 0x82e;
    goto LAB_001904da;
  }
  if (pRVar1->id == 0) {
    sVar7 = strlen(filename);
    iVar2 = strcmp(filename + (sVar7 - 4),".csv");
    if (iVar2 == 0) {
      local_5d8 = 1;
    }
  }
  uVar4 = ref_mpi_all_or(pRVar1,&local_5d8);
  uVar3 = uVar4;
  if (uVar4 != 0) {
    uVar3 = printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x837,"ref_part_metric",(ulong)uVar4,"bcast");
    uVar20 = (ulong)uVar4;
  }
  if (uVar4 != 0) {
    return (REF_STATUS)uVar20;
  }
  pRVar1 = ref_node->ref_mpi;
  if (local_5d8 == 0) {
    local_618 = (FILE *)CONCAT44(local_618._4_4_,(int)CONCAT71((uint7)(uint3)(uVar3 >> 8),1));
    if (pRVar1->id == 0) {
      pFVar9 = fopen(filename,"r");
      if (pFVar9 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x843,"ref_part_metric","unable to open file");
        return 2;
      }
      sVar7 = strlen(filename);
      iVar2 = strcmp(filename + (sVar7 - 4),".sol");
      if (iVar2 == 0) {
        local_5f4 = -1;
        do {
          iVar2 = feof(pFVar9);
          bVar22 = true;
          if ((iVar2 != 0) || (iVar2 = __isoc99_fscanf(pFVar9,"%s",&local_518), iVar2 == -1))
          goto LAB_00191a23;
          if (iVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x84d,"ref_part_metric","line read failed",1,(long)iVar2);
            uVar20 = 1;
          }
          if (iVar2 != 1) {
            return (REF_STATUS)uVar20;
          }
          if (local_510 == 0x6e &&
              CONCAT26(local_518._6_2_,(undefined6)local_518) == 0x6f69736e656d6944) {
            iVar2 = __isoc99_fscanf(pFVar9,"%d",&local_5f4);
            if (iVar2 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x850,"ref_part_metric","read dim",1,(long)iVar2);
              uVar20 = 1;
            }
            if (iVar2 != 1) {
              return (REF_STATUS)uVar20;
            }
          }
        } while (CONCAT44(uStack_50e,CONCAT22(local_510,local_518._6_2_)) != 0x73656369747265 ||
                 CONCAT26(local_518._6_2_,(undefined6)local_518) != 0x72655674416c6f53);
        iVar2 = __isoc99_fscanf(pFVar9,"%d",&local_5a8);
        if (iVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x854,"ref_part_metric","read nnode",1,(long)iVar2);
          uVar20 = 1;
        }
        if (iVar2 != 1) {
          return (REF_STATUS)uVar20;
        }
        lVar8 = ref_node->old_n_global;
        lVar19 = (long)(int)local_5a8;
        if (lVar8 != lVar19) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x856,"ref_part_metric","wrong vertex number in .sol",lVar8,lVar19);
          uVar20 = 1;
        }
        if (lVar8 != lVar19) {
          return (REF_STATUS)uVar20;
        }
        iVar2 = __isoc99_fscanf(pFVar9,"%d",&local_5e0);
        if (iVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x857,"ref_part_metric","read number of types",1,(long)iVar2);
          uVar20 = 1;
        }
        if (iVar2 != 1) {
          return (REF_STATUS)uVar20;
        }
        if ((int)local_5e0 < 1) {
          iVar2 = 0;
        }
        else {
          iVar2 = 0;
          iVar21 = 0;
          do {
            iVar6 = __isoc99_fscanf(pFVar9,"%d",&local_5f0);
            if (iVar6 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x85a,"ref_part_metric","read number of types",1,(long)iVar6);
              uVar20 = 1;
            }
            if (iVar6 != 1) {
              return (REF_STATUS)uVar20;
            }
            if (2 < (uint)local_5f0 - 1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x85d,"ref_part_metric","only types 1 (scalar) or 3 (tensor)) supported");
              printf(" %d type\n",(ulong)(uint)local_5f0);
              return 1;
            }
            iVar2 = iVar2 + (uint)((uint)local_5f0 == 1);
            if ((uint)local_5f0 == 3) {
              if (local_5f4 == 2) {
                iVar2 = iVar2 + 3;
              }
              else {
                iVar2 = iVar2 + 6;
              }
            }
            iVar21 = iVar21 + 1;
          } while (iVar21 < (int)local_5e0);
        }
        if (local_5f4 == 2) {
          if (iVar2 != 3) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x868,"ref_part_metric","2D expects 3 terms of 2x2 metric",3,(long)iVar2);
            uVar20 = 1;
          }
          if (iVar2 != 3) {
            return (REF_STATUS)uVar20;
          }
        }
        else {
          if (iVar2 != 6) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x86a,"ref_part_metric","3D expects 6 terms of 3x3 metric",6,(long)iVar2);
            uVar20 = 1;
          }
          if (iVar2 != 6) {
            return (REF_STATUS)uVar20;
          }
        }
        bVar22 = false;
        iVar2 = __isoc99_fscanf(pFVar9,"%*[^1234567890-+.]");
        if (iVar2 < 0) {
          pcVar16 = "skip blank line";
          uVar13 = 0x86c;
LAB_001923d7:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar13,"ref_part_metric",pcVar16);
          return 1;
        }
LAB_00191a23:
        if (local_5f4 == -1) {
          pcVar16 = "Dimension keyword missing from .sol metric";
          uVar13 = 0x871;
          goto LAB_001923d7;
        }
        if (bVar22) {
          pcVar16 = "SolAtVertices keyword missing from .sol metric";
          uVar13 = 0x872;
          goto LAB_001923d7;
        }
        local_618 = (FILE *)((ulong)local_618 & 0xffffffff00000000);
      }
      else {
        local_5a8 = (REF_DBL *)CONCAT44(local_5a8._4_4_,(int)ref_node->old_n_global);
      }
    }
    else {
      pFVar9 = (FILE *)0x0;
    }
    uVar3 = ref_mpi_bcast(ref_node->ref_mpi,&local_5a8,1,1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x878,
             "ref_part_metric",(ulong)uVar3,"bcast nnode");
      uVar20 = (ulong)uVar3;
    }
    if (uVar3 != 0) {
      return (REF_STATUS)uVar20;
    }
    iVar2 = (int)local_5a8;
    uVar14 = (ulong)(int)local_5a8;
    uVar3 = (int)local_5a8 / ref_node->ref_mpi->n;
    local_5b8 = 100000;
    if (100000 < (int)uVar3) {
      local_5b8 = (ulong)uVar3;
    }
    if ((long)uVar14 <= (long)local_5b8) {
      local_5b8 = uVar14;
    }
    uVar3 = (int)local_5b8 * 6;
    local_600 = (double)CONCAT44(local_600._4_4_,uVar3);
    local_610 = pFVar9;
    if ((long)uVar14 < 0) {
      uVar20 = 1;
      pcVar16 = "malloc metric of REF_DBL negative";
    }
    else {
      pRVar17 = (REF_DBL *)malloc((ulong)uVar3 << 3);
      if (pRVar17 != (REF_DBL *)0x0) {
        bVar22 = true;
        if (iVar2 != 0) {
          uVar14 = 1;
          if (1 < local_600._0_4_) {
            uVar14 = (ulong)local_600 & 0xffffffff;
          }
          lVar8 = 0;
          do {
            *(undefined8 *)((long)pRVar17 + lVar8) = 0xbff0000000000000;
            lVar8 = lVar8 + 8;
          } while (uVar14 * 8 != lVar8);
        }
        goto LAB_001913f5;
      }
      uVar20 = 2;
      pcVar16 = "malloc metric of REF_DBL NULL";
    }
    bVar22 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x87d,
           "ref_part_metric",pcVar16);
    pRVar17 = (REF_DBL *)0x0;
LAB_001913f5:
    if (!bVar22) {
      return (REF_STATUS)uVar20;
    }
    if (0 < (int)local_5a8) {
      uVar14 = 0;
      local_5d0 = pRVar17;
      do {
        local_5c8 = ref_node->old_n_global - uVar14;
        if ((long)local_5b8 < (long)local_5c8) {
          local_5c8 = local_5b8;
        }
        local_5c0 = uVar14;
        if (ref_node->ref_mpi->id == 0) {
          if (0 < (int)(uint)local_5c8) {
            uVar14 = (ulong)((uint)local_5c8 & 0x7fffffff);
            pRVar17 = local_5d0;
            do {
              if ((char)local_618 == '\0') {
                if (local_5f4 == 3) {
                  iVar2 = __isoc99_fscanf(local_610,"%lf %lf %lf %lf %lf %lf",pRVar17,pRVar17 + 1,
                                          pRVar17 + 3,pRVar17 + 2,pRVar17 + 4,pRVar17 + 5);
                  if (iVar2 != 6) {
                    uVar13 = 0x88d;
                    goto LAB_00191554;
                  }
                  goto LAB_0019156f;
                }
                iVar2 = __isoc99_fscanf(local_610,"%lf %lf %lf",pRVar17,pRVar17 + 1,pRVar17 + 3);
                if (iVar2 != 3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x892,"ref_part_metric","metric read error",3,(long)iVar2);
                  uVar20 = 1;
                }
                if (iVar2 != 3) {
                  return (REF_STATUS)uVar20;
                }
                pRVar17[2] = 0.0;
                pRVar17[4] = 0.0;
                pRVar17[5] = 1.0;
              }
              else {
                iVar2 = __isoc99_fscanf(local_610,"%lf %lf %lf %lf %lf %lf",pRVar17,pRVar17 + 1,
                                        pRVar17 + 2,pRVar17 + 3,pRVar17 + 4,pRVar17 + 5);
                if (iVar2 != 6) {
                  uVar13 = 0x89d;
LAB_00191554:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar13,"ref_part_metric","metric read error",6,(long)iVar2);
                  uVar20 = 1;
                }
LAB_0019156f:
                if (iVar2 != 6) {
                  return (REF_STATUS)uVar20;
                }
              }
              pRVar17 = pRVar17 + 6;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          uVar3 = ref_mpi_bcast(ref_node->ref_mpi,local_5d0,local_600._0_4_,3);
          if (uVar3 != 0) {
            uVar13 = 0x8a1;
            goto LAB_00191636;
          }
        }
        else {
          uVar3 = ref_mpi_bcast(ref_node->ref_mpi,local_5d0,local_600._0_4_,3);
          if (uVar3 != 0) {
            uVar13 = 0x8a5;
LAB_00191636:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar13,"ref_part_metric",(ulong)uVar3,"bcast");
            uVar20 = (ulong)uVar3;
          }
        }
        if (uVar3 != 0) {
          return (REF_STATUS)uVar20;
        }
        if (0 < (int)(uint)local_5c8) {
          uVar15 = (ulong)((uint)local_5c8 & 0x7fffffff);
          uVar14 = local_5c0;
          pRVar17 = local_5d0;
          do {
            uVar3 = ref_node_local(ref_node,uVar14,(REF_INT *)local_578);
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x8a9,"ref_part_metric",(ulong)uVar3,"local");
              uVar20 = (ulong)uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return (REF_STATUS)uVar20;
            }
            if (local_578[0]._0_4_ != -1) {
              uVar3 = ref_node_metric_set(ref_node,local_578[0]._0_4_,pRVar17);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x8ac,"ref_part_metric",(ulong)uVar3,"set local node met");
                uVar20 = (ulong)uVar3;
              }
              if (uVar3 != 0) {
                return (REF_STATUS)uVar20;
              }
            }
            pRVar17 = pRVar17 + 6;
            uVar14 = uVar14 + 1;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        uVar14 = local_5c0 + (long)(int)local_5c8;
        pRVar17 = local_5d0;
      } while ((long)uVar14 < (long)(int)local_5a8);
    }
    if (pRVar17 != (REF_DBL *)0x0) {
      free(pRVar17);
    }
    if ((ref_node->ref_mpi->id == 0) && (iVar2 = fclose(local_610), iVar2 != 0)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8b3,
             "ref_part_metric","close file",0,(long)iVar2);
      return 1;
    }
    return 0;
  }
  if (pRVar1->id == 0) {
    pFVar9 = fopen(filename,"r");
    if (pFVar9 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7b1,
             "ref_part_metric_csv","unable to open file");
      uVar20 = 2;
    }
    else {
      pcVar16 = fgets((char *)&local_518,0x400,pFVar9);
      if ((char *)&local_518 == pcVar16) {
        puts((char *)&local_518);
        local_61c = 0;
        pcVar16 = fgets((char *)&local_518,0x400,pFVar9);
        while ((char *)&local_518 == pcVar16) {
          pcVar16 = strtok((char *)&local_518,",");
          if (pcVar16 != (char *)0x0) {
            iVar2 = 0xc;
            do {
              pcVar16 = strtok((char *)0x0,",");
              iVar2 = iVar2 + -1;
            } while (pcVar16 != (char *)0x0);
            if (iVar2 == 0) {
              local_61c = local_61c + 1;
            }
          }
          pcVar16 = fgets((char *)&local_518,0x400,pFVar9);
        }
        printf("nline %d \n");
        uVar20 = (ulong)local_61c;
        if ((int)local_61c < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7bf,"ref_part_metric_csv","malloc xyz of REF_DBL negative");
          uVar20 = 1;
LAB_00191903:
          bVar22 = false;
          local_618 = (FILE *)0x0;
        }
        else {
          uVar3 = local_61c * 3;
          local_618 = (FILE *)malloc(uVar20 * 0x18);
          if (local_618 == (FILE *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x7bf,"ref_part_metric_csv","malloc xyz of REF_DBL NULL");
            uVar20 = 2;
            goto LAB_00191903;
          }
          if (uVar20 != 0) {
            uVar14 = 1;
            if (1 < (int)uVar3) {
              uVar14 = (ulong)uVar3;
            }
            memset(local_618,0,uVar14 << 3);
          }
          bVar22 = true;
        }
        if (!bVar22) goto LAB_00192383;
        uVar14 = (ulong)local_61c;
        if ((int)local_61c < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7c0,"ref_part_metric_csv","malloc metric of REF_DBL negative");
          uVar20 = 1;
LAB_0019233b:
          bVar22 = false;
          local_610 = (FILE *)0x0;
        }
        else {
          local_600 = (double)(uVar14 * 6);
          local_610 = (FILE *)malloc(uVar14 * 0x30);
          if (local_610 == (FILE *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x7c0,"ref_part_metric_csv","malloc metric of REF_DBL NULL");
            uVar20 = 2;
            goto LAB_0019233b;
          }
          if (uVar14 != 0) {
            uVar14 = 1;
            if (1 < SUB84(local_600,0)) {
              uVar14 = (ulong)local_600 & 0xffffffff;
            }
            memset(local_610,0,uVar14 << 3);
          }
          bVar22 = true;
        }
        if (!bVar22) goto LAB_00192383;
        iVar2 = fseek(pFVar9,0,0);
        if (iVar2 == 0) {
          pcVar16 = fgets((char *)&local_518,0x400,pFVar9);
          if ((char *)&local_518 == pcVar16) {
            local_61c = 0;
            while (pcVar16 = fgets((char *)&local_518,0x400,pFVar9), (char *)&local_518 == pcVar16)
            {
              pcVar16 = strtok((char *)&local_518,",");
              if (pcVar16 != (char *)0x0) {
                lVar8 = -0x60;
                do {
                  if (lVar8 == 0) {
                    pcVar16 = "too many col";
                    uVar13 = 0x7c8;
                    goto LAB_00190d84;
                  }
                  dVar18 = atof(pcVar16);
                  *(double *)((long)&local_518 + lVar8) = dVar18;
                  pcVar16 = strtok((char *)0x0,",");
                  lVar8 = lVar8 + 8;
                } while (pcVar16 != (char *)0x0);
                if (lVar8 == 0) {
                  iVar2 = local_61c * 6;
                  *(double *)((long)local_610 + (long)(int)local_61c * 6 * 8) = local_578[0];
                  *(double *)((long)local_610 + (long)(iVar2 + 1) * 8) =
                       (local_578[1] + local_578[3]) * 0.5;
                  *(double *)((long)local_610 + ((long)iVar2 + 2) * 8) =
                       (local_578[2] + local_548) * 0.5;
                  *(REF_DBL *)((long)local_610 + ((long)iVar2 + 3) * 8) = local_558;
                  *(double *)((long)local_610 + ((long)iVar2 + 4) * 8) =
                       (local_550 + local_540) * 0.5;
                  *(REF_DBL *)((long)local_610 + ((long)iVar2 + 5) * 8) = local_538;
                  *(undefined8 *)(&local_618->_flags + (long)(int)local_61c * 6) = local_530;
                  *(undefined8 *)(local_618->_shortbuf + (long)(int)(local_61c * 3) * 8 + -0x7b) =
                       local_528;
                  *(undefined8 *)(local_618->_shortbuf + (long)(int)(local_61c * 3) * 8 + -0x73) =
                       local_520;
                  local_61c = local_61c + 1;
                }
              }
            }
            fclose(pFVar9);
            __s = local_610;
            pFVar9 = local_618;
            goto LAB_00190781;
          }
          pcVar16 = "read header";
          uVar13 = 0x7c2;
        }
        else {
          pcVar16 = "rewind";
          uVar13 = 0x7c1;
        }
      }
      else {
        pcVar16 = "read header";
        uVar13 = 0x7b2;
      }
LAB_00190d84:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13
             ,"ref_part_metric_csv",pcVar16);
      uVar20 = 1;
    }
  }
  else {
    __s = (FILE *)(REF_DBL *)0x0;
    pFVar9 = (FILE *)0x0;
LAB_00190781:
    uVar3 = ref_mpi_bcast(pRVar1,&local_61c,1,1);
    if (uVar3 == 0) {
      if (pRVar1->id == 0) {
LAB_00191a6e:
        uVar3 = ref_mpi_bcast(pRVar1,pFVar9,local_61c * 3,3);
        if (uVar3 == 0) {
          uVar3 = ref_mpi_bcast(pRVar1,__s,local_61c * 6,3);
          if (uVar3 == 0) {
            uVar3 = ref_search_create((REF_SEARCH *)&local_5e0,local_61c);
            if (uVar3 == 0) {
              uVar3 = ref_list_create((REF_LIST *)&local_5f0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x7eb,"ref_part_metric_csv",(ulong)uVar3,"touching list");
                goto LAB_00191ba2;
              }
              local_618 = pFVar9;
              local_610 = __s;
              if (0 < (int)local_61c) {
                lVar8 = 0;
                do {
                  uVar3 = ref_search_insert((REF_SEARCH)CONCAT44(local_5e0._4_4_,(int)local_5e0),
                                            (REF_INT)lVar8,(REF_DBL *)pFVar9,0.0);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x7ee,"ref_part_metric_csv",(ulong)uVar3,"ins");
                    goto LAB_001929a0;
                  }
                  lVar8 = lVar8 + 1;
                  pFVar9 = (FILE *)&pFVar9->_IO_read_base;
                } while (lVar8 < (int)local_61c);
              }
              if (0 < ref_node->max) {
                uVar14 = 0;
                __s = local_610;
                do {
                  if (-1 < ref_node->global[uVar14]) {
                    local_5b8 = uVar14;
                    uVar3 = ref_search_touching((REF_SEARCH)CONCAT44(local_5e0._4_4_,(int)local_5e0)
                                                ,(REF_LIST)CONCAT44(local_5f0._4_4_,(uint)local_5f0)
                                                ,ref_node->real + uVar14 * 0xf,1.0);
                    if (uVar3 == 0) {
                      piVar11 = (int *)CONCAT44(local_5f0._4_4_,(uint)local_5f0);
                      if (*piVar11 < 1) {
                        iVar2 = -1;
                      }
                      else {
                        iVar2 = -1;
                        lVar8 = 0;
                        dVar18 = 1e+200;
                        do {
                          iVar21 = *(int *)(*(long *)(piVar11 + 2) + lVar8 * 4);
                          pRVar17 = ref_node->real;
                          dVar23 = pRVar17[uVar14 * 0xf] -
                                   *(double *)(&local_618->_flags + (long)iVar21 * 6);
                          dVar25 = pRVar17[uVar14 * 0xf + 1] -
                                   *(double *)
                                    (local_618->_shortbuf + (long)(iVar21 * 3) * 8 + -0x7b);
                          dVar24 = pRVar17[uVar14 * 0xf + 2] -
                                   *(double *)
                                    (local_618->_shortbuf + (long)(iVar21 * 3) * 8 + -0x73);
                          dVar23 = dVar24 * dVar24 + dVar25 * dVar25 + dVar23 * dVar23;
                          if (dVar23 < 0.0) {
                            local_600 = dVar18;
                            dVar23 = sqrt(dVar23);
                            dVar18 = local_600;
                          }
                          else {
                            dVar23 = SQRT(dVar23);
                          }
                          if (dVar23 < dVar18) {
                            iVar2 = iVar21;
                            dVar18 = dVar23;
                          }
                          lVar8 = lVar8 + 1;
                          piVar11 = (int *)CONCAT44(local_5f0._4_4_,(uint)local_5f0);
                        } while (lVar8 < *piVar11);
                      }
                      uVar14 = local_5b8;
                      __s = local_610;
                      if (iVar2 == -1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x802,"ref_part_metric_csv","best not found");
                        uVar20 = 1;
                        goto LAB_001929a2;
                      }
                      lVar8 = (long)(iVar2 * 6);
                      local_5a8 = *(REF_DBL **)((long)local_610 + lVar8 * 8);
                      local_5a0 = *(REF_DBL *)((long)local_610 + (long)(iVar2 * 6 + 1) * 8);
                      local_598 = *(REF_DBL *)((long)local_610 + (lVar8 + 2) * 8);
                      local_590 = *(REF_DBL *)((long)local_610 + (lVar8 + 3) * 8);
                      local_588 = *(REF_DBL *)((long)local_610 + (lVar8 + 4) * 8);
                      local_580 = *(REF_DBL *)((long)local_610 + (lVar8 + 5) * 8);
                      uVar3 = ref_node_metric_set(ref_node,(REF_INT)local_5b8,(REF_DBL *)&local_5a8)
                      ;
                      if (uVar3 == 0) {
                        uVar3 = ref_list_erase((REF_LIST)CONCAT44(local_5f0._4_4_,(uint)local_5f0));
                        if (uVar3 == 0) goto LAB_0019294a;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x80a,"ref_part_metric_csv",(ulong)uVar3,"erase");
                        uVar20 = (ulong)uVar3;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x809,"ref_part_metric_csv",(ulong)uVar3,"set local node met");
                        uVar20 = (ulong)uVar3;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x7f4,"ref_part_metric_csv",(ulong)uVar3,"search tree");
                      uVar20 = (ulong)uVar3;
                    }
                    bVar22 = false;
                    pFVar9 = local_618;
                    goto LAB_00191ba4;
                  }
LAB_0019294a:
                  uVar14 = uVar14 + 1;
                } while ((long)uVar14 < (long)ref_node->max);
              }
              uVar3 = ref_list_free((REF_LIST)CONCAT44(local_5f0._4_4_,(uint)local_5f0));
              if (uVar3 == 0) {
                uVar3 = ref_search_free((REF_SEARCH)CONCAT44(local_5e0._4_4_,(int)local_5e0));
                __s = local_610;
                pFVar9 = local_618;
                bVar22 = uVar3 == 0;
                if (!bVar22) {
                  bVar22 = false;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x80d,"ref_part_metric_csv",(ulong)uVar3,"free search");
                  uVar20 = (ulong)uVar3;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x80c,"ref_part_metric_csv",(ulong)uVar3,"free list");
LAB_001929a0:
                uVar20 = (ulong)uVar3;
LAB_001929a2:
                bVar22 = false;
                __s = local_610;
                pFVar9 = local_618;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x7ea,"ref_part_metric_csv",(ulong)uVar3,"create search");
LAB_00191ba2:
              uVar20 = (ulong)uVar3;
              bVar22 = false;
            }
LAB_00191ba4:
            if (bVar22) {
              if (pFVar9 != (FILE *)0x0) {
                free(pFVar9);
              }
              uVar20 = 0;
              if (__s != (FILE *)0x0) {
                free(__s);
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x7e2,"ref_part_metric_csv",(ulong)uVar3,"bcast metric");
            uVar20 = (ulong)uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7e1,"ref_part_metric_csv",(ulong)uVar3,"bcast xyz");
          uVar20 = (ulong)uVar3;
        }
      }
      else {
        uVar14 = (ulong)local_61c;
        local_610 = __s;
        if ((int)local_61c < 0) {
          bVar22 = false;
          local_618 = pFVar9;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7de,"ref_part_metric_csv","malloc xyz of REF_DBL negative");
          uVar20 = 1;
        }
        else {
          uVar3 = local_61c * 3;
          pFVar9 = (FILE *)malloc(uVar14 * 0x18);
          if (pFVar9 == (FILE *)0x0) {
            bVar22 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x7de,"ref_part_metric_csv","malloc xyz of REF_DBL NULL");
            uVar20 = 2;
            local_618 = (FILE *)0x0;
          }
          else {
            bVar22 = true;
            local_618 = pFVar9;
            if (uVar14 != 0) {
              uVar14 = 1;
              if (1 < (int)uVar3) {
                uVar14 = (ulong)uVar3;
              }
              memset(pFVar9,0,uVar14 << 3);
            }
          }
        }
        if (bVar22) {
          uVar14 = (ulong)local_61c;
          if ((int)local_61c < 0) {
            bVar22 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x7df,"ref_part_metric_csv","malloc metric of REF_DBL negative");
            uVar20 = 1;
            __s = local_610;
          }
          else {
            uVar3 = local_61c * 6;
            __s = (FILE *)malloc(uVar14 * 0x30);
            if (__s == (FILE *)0x0) {
              bVar22 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x7df,"ref_part_metric_csv","malloc metric of REF_DBL NULL");
              uVar20 = 2;
              __s = (FILE *)(REF_DBL *)0x0;
            }
            else {
              bVar22 = true;
              if (uVar14 != 0) {
                uVar14 = 1;
                if (1 < (int)uVar3) {
                  uVar14 = (ulong)uVar3;
                }
                memset(__s,0,uVar14 << 3);
              }
            }
          }
          pFVar9 = local_618;
          if (bVar22) goto LAB_00191a6e;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7dc,
             "ref_part_metric_csv",(ulong)uVar3,"bcast line");
      uVar20 = (ulong)uVar3;
    }
  }
LAB_00192383:
  if ((int)uVar20 == 0) {
    return 0;
  }
  pcVar16 = "part metric .csv";
  uVar13 = 0x83a;
LAB_001904da:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
         "ref_part_metric",uVar20,pcVar16);
  return (REF_STATUS)uVar20;
}

Assistant:

REF_FCN REF_STATUS ref_part_metric(REF_NODE ref_node, const char *filename) {
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT section_size;
  REF_GLOB nnode_read, global;
  REF_INT node, local;
  size_t end_of_string;
  REF_BOOL sol_format, found_keyword;
  REF_INT nnode, ntype, type;
  REF_INT ldim, i;
  REF_INT status;
  char line[1024];
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL csv_format = REF_FALSE;
  REF_INT dim = REF_EMPTY;

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &solb_format), "bcast");

  if (solb_format) {
    RSS(ref_part_metric_solb(ref_node, filename), "part metric .solb");
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".csv") == 0)
      csv_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_node_mpi(ref_node), &csv_format), "bcast");

  if (csv_format) {
    RSS(ref_part_metric_csv(ref_node, filename), "part metric .csv");
    return REF_SUCCESS;
  }

  file = NULL;
  sol_format = REF_FALSE;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (strcmp(&filename[end_of_string - 4], ".sol") == 0) {
      sol_format = REF_TRUE;
      found_keyword = REF_FALSE;
      dim = REF_EMPTY;
      while (!feof(file)) {
        status = fscanf(file, "%s", line);
        if (EOF == status) break;
        REIS(1, status, "line read failed");

        if (0 == strcmp("Dimension", line)) {
          REIS(1, fscanf(file, "%d", &dim), "read dim");
        }

        if (0 == strcmp("SolAtVertices", line)) {
          REIS(1, fscanf(file, "%d", &nnode), "read nnode");
          REIS(ref_node_n_global(ref_node), nnode,
               "wrong vertex number in .sol");
          REIS(1, fscanf(file, "%d", &ntype), "read number of types");
          ldim = 0;
          for (i = 0; i < ntype; i++) {
            REIS(1, fscanf(file, "%d", &type), "read number of types");
            RAB(1 <= type && type <= 3,
                "only types 1 (scalar) or 3 (tensor)) supported",
                { printf(" %d type\n", type); });
            if (1 == type) ldim += 1;
            if (3 == type) {
              if (2 == dim) {
                ldim += 3;
              } else {
                ldim += 6;
              }
            }
          }
          if (2 == dim) {
            REIS(3, ldim, "2D expects 3 terms of 2x2 metric");
          } else {
            REIS(6, ldim, "3D expects 6 terms of 3x3 metric");
          }
          RAS(0 <= fscanf(file, "%*[^1234567890-+.]"), "skip blank line");
          found_keyword = REF_TRUE;
          break;
        }
      }
      RUS(REF_EMPTY, dim, "Dimension keyword missing from .sol metric");
      RAS(found_keyword, "SolAtVertices keyword missing from .sol metric");
    } else {
      nnode = (REF_INT)ref_node_n_global(ref_node);
    }
  }
  RSS(ref_mpi_bcast(ref_node_mpi(ref_node), &nnode, 1, REF_INT_TYPE),
      "bcast nnode");

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 6 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (node = 0; node < section_size; node++)
        if (sol_format) {
          if (3 == dim) {
            REIS(6,
                 fscanf(file, "%lf %lf %lf %lf %lf %lf",
                        &(metric[0 + 6 * node]), &(metric[1 + 6 * node]),
                        &(metric[3 + 6 * node]), /* transposed 3,2 */
                        &(metric[2 + 6 * node]), &(metric[4 + 6 * node]),
                        &(metric[5 + 6 * node])),
                 "metric read error");
          } else {
            REIS(3,
                 fscanf(file, "%lf %lf %lf", &(metric[0 + 6 * node]),
                        &(metric[1 + 6 * node]), &(metric[3 + 6 * node])),
                 "metric read error");
            metric[2 + 6 * node] = 0.0; /* m13 */
            metric[4 + 6 * node] = 0.0; /* m23 */
            metric[5 + 6 * node] = 1.0; /* m33 */
          }
        } else {
          REIS(6,
               fscanf(file, "%lf %lf %lf %lf %lf %lf", &(metric[0 + 6 * node]),
                      &(metric[1 + 6 * node]), &(metric[2 + 6 * node]),
                      &(metric[3 + 6 * node]), &(metric[4 + 6 * node]),
                      &(metric[5 + 6 * node])),
               "metric read error");
        }
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), metric, 6 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_set(ref_node, local, &(metric[6 * node])),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_mpi_once(ref_node_mpi(ref_node))) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}